

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O2

void __thiscall TWeightedList<FDecalBase_*>::RecalcRandomVals(TWeightedList<FDecalBase_*> *this)

{
  Choice<FDecalBase_*> *pCVar1;
  Choice<FDecalBase_*> *pCVar2;
  int iVar3;
  Choice<FDecalBase_*> *pCVar4;
  double dVar5;
  
  pCVar2 = this->Choices;
  if (pCVar2 != (Choice<FDecalBase_*> *)0x0) {
    iVar3 = 0;
    pCVar1 = pCVar2;
    do {
      pCVar4 = pCVar1;
      iVar3 = iVar3 + (uint)pCVar4->Weight;
      pCVar1 = pCVar4->Next;
    } while (pCVar4->Next != (Choice<FDecalBase_*> *)0x0);
    pCVar4->RandomVal = 0xff;
    dVar5 = 0.0;
    while (pCVar2->Next != (Choice<FDecalBase_*> *)0x0) {
      dVar5 = dVar5 + (double)pCVar2->Weight * (1.0 / (double)iVar3);
      pCVar2->RandomVal = (BYTE)(int)(dVar5 * 255.0);
      pCVar2 = pCVar2->Next;
    }
  }
  return;
}

Assistant:

void TWeightedList<T>::RecalcRandomVals ()
{
	// Redistribute the RandomVals so that they form the correct
	// distribution (as determined by the range of weights).

	int numChoices, weightSums;
	Choice<T> *choice;
	double randVal, weightDenom;

	if (Choices == NULL)
	{ // No choices, so nothing to do.
		return;
	}

	numChoices = 1;
	weightSums = 0;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		++numChoices;
		weightSums += choice->Weight;
	}

	weightSums += choice->Weight;
	choice->RandomVal = 255;	// The last choice is always randomval 255

	randVal = 0.0;
	weightDenom = 1.0 / (double)weightSums;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		randVal += (double)choice->Weight * weightDenom;
		choice->RandomVal = (BYTE)(randVal * 255.0);
	}
}